

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLObjectWrapper.hpp
# Opt level: O2

void __thiscall
GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLShaderObjCreateReleaseHelper>::Create
          (GLObjWrapper<GLObjectWrappers::GLShaderObjCreateReleaseHelper> *this)

{
  GLuint GVar1;
  string msg;
  
  if (this->m_uiHandle != 0) {
    Diligent::FormatString<char[33]>(&msg,(char (*) [33])"GL object is already initialized");
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLObjectWrapper.hpp"
               ,0x5a);
    std::__cxx11::string::~string((string *)&msg);
    if (this->m_uiHandle != 0) {
      (*__glewDeleteShader)(this->m_uiHandle);
      this->m_uiHandle = 0;
    }
  }
  GVar1 = (*__glewCreateShader)((this->m_CreateReleaseHelper).m_ShaderType);
  this->m_uiHandle = GVar1;
  if (GVar1 == 0) {
    Diligent::FormatString<char[31]>(&msg,(char (*) [31])"Failed to initialize GL object");
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"Create",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/GLObjectWrapper.hpp"
               ,0x5d);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void Create()
    {
        VERIFY(m_uiHandle == 0, "GL object is already initialized");
        Release();
        m_CreateReleaseHelper.Create(m_uiHandle);
        VERIFY(m_uiHandle, "Failed to initialize GL object");
    }